

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::LJAtypeParameters> *this)

{
  void *in_RDI;
  
  ~SimpleTypeData((SimpleTypeData<OpenMD::LJAtypeParameters> *)0x3454f8);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}